

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t * roaring_bitmap_add_offset(roaring_bitmap_t *bm,int64_t offset)

{
  uint16_t uVar1;
  container_t **lo_00;
  container_t *candidate_shared_container;
  long in_RSI;
  roaring_array_t *in_RDI;
  int i_1;
  int64_t k;
  container_t **hi_ptr;
  container_t **lo_ptr;
  container_t *hi;
  container_t *lo;
  container_t *c;
  uint8_t t;
  int64_t key;
  int j;
  int i;
  _Bool cow;
  int length;
  roaring_array_t *bm_ra;
  uint16_t in_offset;
  int64_t container_offset;
  roaring_array_t *ans_ra;
  roaring_bitmap_t *answer;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int iVar2;
  roaring_array_t *in_stack_ffffffffffffff70;
  undefined1 *puVar3;
  roaring_array_t *ra;
  roaring_bitmap_t *in_stack_ffffffffffffff88;
  long lVar4;
  roaring_array_t *in_stack_ffffffffffffff90;
  uint8_t local_59;
  uint8_t *local_58;
  int local_50;
  int local_4c;
  undefined1 local_45;
  int local_44;
  roaring_array_t *local_40;
  short local_32;
  long local_30;
  roaring_bitmap_t *local_28;
  roaring_bitmap_t *local_20;
  roaring_array_t *local_10;
  roaring_bitmap_t *local_8;
  
  local_44 = in_RDI->size;
  if (in_RSI == 0) {
    local_8 = roaring_bitmap_copy(in_stack_ffffffffffffff88);
  }
  else {
    local_30 = in_RSI >> 0x10;
    local_32 = (short)in_RSI;
    local_40 = in_RDI;
    local_10 = in_RDI;
    local_20 = roaring_bitmap_create();
    local_45 = is_cow((roaring_bitmap_t *)local_10);
    roaring_bitmap_set_copy_on_write(local_20,(_Bool)local_45);
    local_28 = local_20;
    if (local_32 == 0) {
      local_50 = 0;
      for (local_4c = 0; local_4c < local_44; local_4c = local_4c + 1) {
        uVar1 = ra_get_key_at_index(local_40,(uint16_t)local_4c);
        local_58 = (uint8_t *)(local_30 + (ulong)uVar1);
        if ((-1 < (long)local_58) && ((long)local_58 < 0x10000)) {
          ra_append_copy(in_stack_ffffffffffffff70,
                         (roaring_array_t *)
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0,false);
          (local_28->high_low_container).keys[local_50] = (uint16_t)local_58;
          local_50 = local_50 + 1;
        }
      }
      local_8 = local_20;
    }
    else {
      for (iVar2 = 0; iVar2 < local_44; iVar2 = iVar2 + 1) {
        lVar4 = 0;
        in_stack_ffffffffffffff90 = (roaring_array_t *)0x0;
        puVar3 = (undefined1 *)0x0;
        ra = (roaring_array_t *)0x0;
        uVar1 = ra_get_key_at_index(local_40,(uint16_t)iVar2);
        lo_00 = (container_t **)((ulong)uVar1 + local_30);
        if ((-1 < (long)lo_00) && ((long)lo_00 < 0x10000)) {
          ra = (roaring_array_t *)&stack0xffffffffffffff90;
        }
        if ((-1 < (long)lo_00 + 1) && ((long)lo_00 + 1 < 0x10000)) {
          puVar3 = &stack0xffffffffffffff88;
        }
        if ((ra != (roaring_array_t *)0x0) || (puVar3 != (undefined1 *)0x0)) {
          candidate_shared_container = ra_get_container_at_index(local_40,(uint16_t)iVar2,&local_59)
          ;
          uVar1 = (uint16_t)((ulong)puVar3 >> 0x30);
          container_unwrap_shared(candidate_shared_container,&local_59);
          container_add_offset
                    (ra,(uint8_t)(uVar1 >> 8),lo_00,
                     (container_t **)CONCAT44(iVar2,in_stack_ffffffffffffff68),0);
          if (in_stack_ffffffffffffff90 != (roaring_array_t *)0x0) {
            offset_append_with_merge
                      (in_stack_ffffffffffffff90,(int)((ulong)lVar4 >> 0x20),ra,
                       (uint8_t)(uVar1 >> 8));
          }
          if (lVar4 != 0) {
            ra_append(ra,uVar1,lo_00,(uint8_t)((uint)iVar2 >> 0x18));
          }
        }
      }
      roaring_bitmap_repair_after_lazy((roaring_bitmap_t *)in_stack_ffffffffffffff90);
      local_8 = local_20;
    }
  }
  return local_8;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_add_offset(const roaring_bitmap_t *bm,
                                            int64_t offset) {
    roaring_bitmap_t *answer;
    roaring_array_t *ans_ra;
    int64_t container_offset;
    uint16_t in_offset;

    const roaring_array_t *bm_ra = &bm->high_low_container;
    int length = bm_ra->size;

    if (offset == 0) {
        return roaring_bitmap_copy(bm);
    }

    container_offset = offset >> 16;
    in_offset = (uint16_t)(offset - container_offset * (1 << 16));

    answer = roaring_bitmap_create();
    bool cow = is_cow(bm);
    roaring_bitmap_set_copy_on_write(answer, cow);

    ans_ra = &answer->high_low_container;

    if (in_offset == 0) {
        ans_ra = &answer->high_low_container;

        for (int i = 0, j = 0; i < length; ++i) {
            int64_t key = ra_get_key_at_index(bm_ra, (uint16_t)i);
            key += container_offset;

            if (key < 0 || key >= (1 << 16)) {
                continue;
            }
            ra_append_copy(ans_ra, bm_ra, (uint16_t)i, cow);
            ans_ra->keys[j++] = (uint16_t)key;
        }
        return answer;
    }

    uint8_t t;
    const container_t *c;
    container_t *lo, *hi, **lo_ptr, **hi_ptr;
    int64_t k;

    for (int i = 0; i < length; ++i) {
        lo = hi = NULL;
        lo_ptr = hi_ptr = NULL;

        k = ra_get_key_at_index(bm_ra, (uint16_t)i) + container_offset;
        if (k >= 0 && k < (1 << 16)) {
            lo_ptr = &lo;
        }
        if (k + 1 >= 0 && k + 1 < (1 << 16)) {
            hi_ptr = &hi;
        }
        if (lo_ptr == NULL && hi_ptr == NULL) {
            continue;
        }
        c = ra_get_container_at_index(bm_ra, (uint16_t)i, &t);
        c = container_unwrap_shared(c, &t);

        container_add_offset(c, t, lo_ptr, hi_ptr, in_offset);
        if (lo != NULL) {
            offset_append_with_merge(ans_ra, (int)k, lo, t);
        }
        if (hi != NULL) {
            ra_append(ans_ra, (uint16_t)(k + 1), hi, t);
        }
        // the `lo` and `hi` container type always keep same as container `c`.
        // in the case of `container_add_offset` on bitset container, `lo` and
        // `hi` may has small cardinality, they must be repaired to array
        // container.
    }

    roaring_bitmap_repair_after_lazy(answer);  // do required type conversions.
    return answer;
}